

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

Node * __thiscall anon_unknown.dwarf_5f811d::Db::parseFunctionType(Db *this)

{
  short *psVar1;
  Node **ppNVar2;
  Node **ppNVar3;
  char *pcVar4;
  Qualifiers QVar5;
  short *psVar6;
  short *psVar7;
  Node *pNVar8;
  Node *pNVar9;
  _func_int **pp_Var10;
  long lVar11;
  undefined1 uVar12;
  NodeArray NVar13;
  Node *T;
  Node *local_40;
  Qualifiers local_34;
  
  QVar5 = parseCVQualifiers(this);
  psVar6 = (short *)this->First;
  psVar7 = (short *)this->Last;
  if (1 < (ulong)((long)psVar7 - (long)psVar6)) {
    if (*psVar6 == 0x6f44) {
      this->First = (char *)(psVar6 + 1);
      pp_Var10 = (_func_int **)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
      *(undefined4 *)(pp_Var10 + 1) = 0x1010107;
      *pp_Var10 = (_func_int *)&PTR_hasRHSComponentSlow_002546d0;
      pp_Var10[2] = (_func_int *)"noexcept";
      pp_Var10[3] = (_func_int *)0x215e98;
      goto LAB_001ecabc;
    }
    if (*psVar6 == 0x4f44) {
      this->First = (char *)(psVar6 + 1);
      pNVar8 = parseExpr(this);
      if (pNVar8 == (Node *)0x0) {
        return (Node *)0x0;
      }
      pcVar4 = this->First;
      if (pcVar4 == this->Last) {
        return (Node *)0x0;
      }
      if (*pcVar4 != 'E') {
        return (Node *)0x0;
      }
      this->First = pcVar4 + 1;
      pp_Var10 = (_func_int **)BumpPointerAllocator::allocate(&this->ASTAllocator,0x18);
      *(undefined4 *)(pp_Var10 + 1) = 0x1010110;
      *pp_Var10 = (_func_int *)&PTR_hasRHSComponentSlow_00255858;
      pp_Var10[2] = (_func_int *)pNVar8;
      goto LAB_001ecabc;
    }
    if (*psVar6 == 0x7744) {
      psVar6 = psVar6 + 1;
      this->First = (char *)psVar6;
      ppNVar2 = (this->Names).Last;
      ppNVar3 = (this->Names).First;
      while ((psVar6 == psVar7 || ((char)*psVar6 != 'E'))) {
        local_40 = parseType(this);
        if (local_40 == (Node *)0x0) {
          return (Node *)0x0;
        }
        PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Names,&local_40);
        psVar7 = (short *)this->Last;
        psVar6 = (short *)this->First;
      }
      this->First = (char *)((long)psVar6 + 1);
      NVar13 = popTrailingNodeArray(this,(long)ppNVar2 - (long)ppNVar3 >> 3);
      pp_Var10 = (_func_int **)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
      *(undefined4 *)(pp_Var10 + 1) = 0x1010111;
      *pp_Var10 = (_func_int *)&PTR_hasRHSComponentSlow_002558b0;
      *(NodeArray *)(pp_Var10 + 2) = NVar13;
      goto LAB_001ecabc;
    }
  }
  pp_Var10 = (_func_int **)0x0;
LAB_001ecabc:
  psVar7 = (short *)this->First;
  psVar6 = (short *)this->Last;
  if ((1 < (ulong)((long)psVar6 - (long)psVar7)) && (*psVar7 == 0x7844)) {
    psVar7 = psVar7 + 1;
    this->First = (char *)psVar7;
  }
  if ((psVar7 != psVar6) && ((char)*psVar7 == 'F')) {
    psVar1 = (short *)((long)psVar7 + 1);
    this->First = (char *)psVar1;
    if ((psVar1 != psVar6) && (*(char *)psVar1 == 'Y')) {
      this->First = (char *)(psVar7 + 1);
    }
    pNVar8 = parseType(this);
    if (pNVar8 != (Node *)0x0) {
      ppNVar2 = (this->Names).Last;
      ppNVar3 = (this->Names).First;
      local_34 = QVar5;
      do {
        while( true ) {
          psVar7 = (short *)this->First;
          if (psVar7 == (short *)this->Last) break;
          if ((char)*psVar7 != 'v') {
            if ((char)*psVar7 == 'E') {
              uVar12 = 0;
              lVar11 = 1;
              goto LAB_001ecc17;
            }
            break;
          }
          this->First = (char *)((long)psVar7 + 1);
        }
        if (1 < (ulong)((long)this->Last - (long)psVar7)) {
          lVar11 = 2;
          if (*psVar7 == 0x4552) {
            uVar12 = 1;
LAB_001ecc17:
            this->First = (char *)((long)psVar7 + lVar11);
            NVar13 = popTrailingNodeArray(this,(long)ppNVar2 - (long)ppNVar3 >> 3);
            pNVar9 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x38);
            pNVar9->K = KFunctionType;
            pNVar9->RHSComponentCache = Yes;
            pNVar9->ArrayCache = No;
            pNVar9->FunctionCache = Yes;
            pNVar9->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00255908;
            pNVar9[1]._vptr_Node = (_func_int **)pNVar8;
            *(NodeArray *)&pNVar9[1].K = NVar13;
            pNVar9[2].K = (undefined1)local_34;
            pNVar9[2].RHSComponentCache = local_34._1_1_;
            pNVar9[2].ArrayCache = local_34._2_1_;
            pNVar9[2].FunctionCache = local_34._3_1_;
            pNVar9[2].field_0xc = uVar12;
            pNVar9[3]._vptr_Node = pp_Var10;
            return pNVar9;
          }
          if (*psVar7 == 0x454f) {
            uVar12 = 2;
            goto LAB_001ecc17;
          }
        }
        local_40 = parseType(this);
        if (local_40 == (Node *)0x0) {
          return (Node *)0x0;
        }
        PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Names,&local_40);
      } while( true );
    }
  }
  return (Node *)0x0;
}

Assistant:

Node *Db::parseFunctionType() {
  Qualifiers CVQuals = parseCVQualifiers();

  Node *ExceptionSpec = nullptr;
  if (consumeIf("Do")) {
    ExceptionSpec = make<NameType>("noexcept");
  } else if (consumeIf("DO")) {
    Node *E = parseExpr();
    if (E == nullptr || !consumeIf('E'))
      return nullptr;
    ExceptionSpec = make<NoexceptSpec>(E);
  } else if (consumeIf("Dw")) {
    size_t SpecsBegin = Names.size();
    while (!consumeIf('E')) {
      Node *T = parseType();
      if (T == nullptr)
        return nullptr;
      Names.push_back(T);
    }
    ExceptionSpec =
      make<DynamicExceptionSpec>(popTrailingNodeArray(SpecsBegin));
  }

  consumeIf("Dx"); // transaction safe

  if (!consumeIf('F'))
    return nullptr;
  consumeIf('Y'); // extern "C"
  Node *ReturnType = parseType();
  if (ReturnType == nullptr)
    return nullptr;

  FunctionRefQual ReferenceQualifier = FrefQualNone;
  size_t ParamsBegin = Names.size();
  while (true) {
    if (consumeIf('E'))
      break;
    if (consumeIf('v'))
      continue;
    if (consumeIf("RE")) {
      ReferenceQualifier = FrefQualLValue;
      break;
    }
    if (consumeIf("OE")) {
      ReferenceQualifier = FrefQualRValue;
      break;
    }
    Node *T = parseType();
    if (T == nullptr)
      return nullptr;
    Names.push_back(T);
  }

  NodeArray Params = popTrailingNodeArray(ParamsBegin);
  return make<FunctionType>(ReturnType, Params, CVQuals,
                            ReferenceQualifier, ExceptionSpec);
}